

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O3

bool spvtools::val::anon_unknown_2::ContainsInvalidBool
               (ValidationState_t *_,Instruction *storage,bool skip_builtin)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  Instruction *pIVar6;
  undefined7 in_register_00000011;
  size_t index;
  uint32_t local_2c;
  
  if ((int)CONCAT71(in_register_00000011,skip_builtin) != 0) {
    local_2c = (storage->inst_).result_id;
    pmVar4 = std::
             map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
             ::operator[](&_->id_decorations_,&local_2c);
    for (p_Var5 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      if (p_Var5[1]._M_color == 0xb) {
        return false;
      }
    }
  }
  uVar1 = (storage->inst_).opcode;
  if (uVar1 < 0x1f) {
    if ((0x31800000U >> (uVar1 & 0x1f) & 1) != 0) {
      uVar3 = Instruction::GetOperandAs<unsigned_int>(storage,1);
      pIVar6 = ValidationState_t::FindDef(_,uVar3);
      bVar2 = ContainsInvalidBool(_,pIVar6,skip_builtin);
      return bVar2;
    }
    if (uVar1 == 0x14) {
      return true;
    }
    if ((uVar1 == 0x1e) &&
       (0x10 < (ulong)((long)(storage->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(storage->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start))) {
      index = 1;
      do {
        uVar3 = Instruction::GetOperandAs<unsigned_int>(storage,index);
        pIVar6 = ValidationState_t::FindDef(_,uVar3);
        bVar2 = ContainsInvalidBool(_,pIVar6,skip_builtin);
        if (bVar2) {
          return true;
        }
        index = index + 1;
      } while (index < (ulong)((long)(storage->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(storage->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
  }
  return false;
}

Assistant:

bool ContainsInvalidBool(ValidationState_t& _, const Instruction* storage,
                         bool skip_builtin) {
  if (skip_builtin) {
    for (const Decoration& decoration : _.id_decorations(storage->id())) {
      if (decoration.dec_type() == spv::Decoration::BuiltIn) return false;
    }
  }

  const size_t elem_type_index = 1;
  uint32_t elem_type_id;
  Instruction* elem_type;

  switch (storage->opcode()) {
    case spv::Op::OpTypeBool:
      return true;
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
      elem_type_id = storage->GetOperandAs<uint32_t>(elem_type_index);
      elem_type = _.FindDef(elem_type_id);
      return ContainsInvalidBool(_, elem_type, skip_builtin);
    case spv::Op::OpTypeStruct:
      for (size_t member_type_index = 1;
           member_type_index < storage->operands().size();
           ++member_type_index) {
        auto member_type_id =
            storage->GetOperandAs<uint32_t>(member_type_index);
        auto member_type = _.FindDef(member_type_id);
        if (ContainsInvalidBool(_, member_type, skip_builtin)) return true;
      }
    default:
      break;
  }
  return false;
}